

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O3

void __thiscall
sqvector<SQVM::CallInfo,_unsigned_int>::resize
          (sqvector<SQVM::CallInfo,_unsigned_int> *this,size_type newsize,CallInfo *fill)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr *pSVar2;
  SQObjectValue SVar3;
  SQGenerator *pSVar4;
  SQObjectFlags SVar5;
  undefined3 uVar6;
  SQInt32 SVar7;
  SQInt32 SVar8;
  undefined4 uVar9;
  SQInt32 SVar10;
  SQInt32 SVar11;
  CallInfo *pCVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  
  uVar15 = (ulong)newsize;
  if (this->_allocated < newsize) {
    pCVar12 = (CallInfo *)
              sq_vm_realloc(this->_alloc_ctx,this->_vals,(ulong)this->_allocated * 0x48,
                            uVar15 * 0x48);
    this->_vals = pCVar12;
    this->_allocated = newsize;
  }
  uVar13 = this->_size;
  if (uVar13 < newsize) {
    do {
      pCVar12 = this->_vals + uVar13;
      pSVar2 = fill->_literals;
      pCVar12->_ip = fill->_ip;
      pCVar12->_literals = pSVar2;
      SVar5 = (fill->_closure).super_SQObject._flags;
      uVar6 = *(undefined3 *)&(fill->_closure).super_SQObject.field_0x5;
      SVar3 = (fill->_closure).super_SQObject._unVal;
      (pCVar12->_closure).super_SQObject._type = (fill->_closure).super_SQObject._type;
      (pCVar12->_closure).super_SQObject._flags = SVar5;
      *(undefined3 *)&(pCVar12->_closure).super_SQObject.field_0x5 = uVar6;
      (pCVar12->_closure).super_SQObject._unVal = SVar3;
      if (((pCVar12->_closure).super_SQObject._type & 0x8000000) != 0) {
        pSVar1 = &(((pCVar12->_closure).super_SQObject._unVal.pTable)->super_SQDelegable).
                  super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      pCVar12->_root = fill->_root;
      pSVar4 = fill->_generator;
      SVar10 = fill->_etraps;
      SVar11 = fill->_prevstkbase;
      SVar7 = fill->_target;
      SVar8 = fill->_ncalls;
      uVar9 = *(undefined4 *)&fill->field_0x3c;
      pCVar12->_prevtop = fill->_prevtop;
      pCVar12->_target = SVar7;
      pCVar12->_ncalls = SVar8;
      *(undefined4 *)&pCVar12->field_0x3c = uVar9;
      pCVar12->_generator = pSVar4;
      pCVar12->_etraps = SVar10;
      pCVar12->_prevstkbase = SVar11;
      uVar13 = this->_size + 1;
      this->_size = uVar13;
    } while (uVar13 < newsize);
  }
  else {
    if (newsize < uVar13) {
      lVar14 = uVar15 * 0x48 + 0x10;
      do {
        SQObjectPtr::~SQObjectPtr((SQObjectPtr *)((long)&this->_vals->_ip + lVar14));
        uVar15 = uVar15 + 1;
        lVar14 = lVar14 + 0x48;
      } while (uVar15 < this->_size);
    }
    this->_size = newsize;
  }
  return;
}

Assistant:

void resize(size_type newsize, const T& fill = T())
    {
        if(newsize > _allocated)
            _realloc(newsize);
        if(newsize > _size) {
            while(_size < newsize) {
                new ((void *)&_vals[_size]) T(fill);
                _size++;
            }
        }
        else{
            for(size_type i = newsize; i < _size; i++) {
                _vals[i].~T();
            }
            _size = newsize;
        }
    }